

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O3

void __thiscall soplex::DSVectorBase<double>::add(DSVectorBase<double> *this,int i,double *v)

{
  double dVar1;
  int iVar2;
  Nonzero<double> *pNVar3;
  
  makeMem(this,1);
  dVar1 = *v;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    iVar2 = (this->super_SVectorBase<double>).memused;
    pNVar3 = (this->super_SVectorBase<double>).m_elem;
    pNVar3[iVar2].idx = i;
    pNVar3[iVar2].val = dVar1;
    (this->super_SVectorBase<double>).memused = iVar2 + 1;
  }
  return;
}

Assistant:

void add(int i, const R& v)
   {
      makeMem(1);
      SVectorBase<R>::add(i, v);
   }